

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O3

DefaultValueObjectWriter * __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::RenderBytes
          (DefaultValueObjectWriter *this,StringPiece name,StringPiece value)

{
  iterator __position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  _Alloc_hider _Var2;
  size_t size;
  pointer puVar3;
  char *pcVar4;
  StringPiece name_00;
  DataPiece local_60;
  stringpiece_ssize_type local_38;
  
  pcVar4 = value.ptr_;
  local_38 = name.length_;
  name_00.ptr_ = name.ptr_;
  if (this->current_ == (Node *)0x0) {
    (*this->ow_->_vptr_ObjectWriter[0xe])(this->ow_,name_00.ptr_,local_38,pcVar4,value.length_);
  }
  else {
    local_60._vptr_DataPiece = (_func_int **)operator_new(0x20);
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._vptr_DataPiece)
    ->_M_dataplus)._M_p =
         (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_60._vptr_DataPiece)->field_2;
    if (pcVar4 == (char *)0x0) {
      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._vptr_DataPiece
      )->_M_string_length = 0;
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_60._vptr_DataPiece)->field_2)._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_60._vptr_DataPiece,pcVar4,pcVar4 + value.length_);
    }
    __position._M_current =
         (this->string_values_).
         super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->string_values_).
        super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>
      ::_M_realloc_insert<std::__cxx11::string*>
                ((vector<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>
                  *)&this->string_values_,__position,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_60);
      puVar3 = (this->string_values_).
               super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      ((__position._M_current)->_M_t).
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_60._vptr_DataPiece;
      puVar3 = (this->string_values_).
               super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->string_values_).
      super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar3;
    }
    pbVar1 = puVar3[-1]._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    _Var2._M_p = (pbVar1->_M_dataplus)._M_p;
    size = pbVar1->_M_string_length;
    if ((long)size < 0) {
      StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
    }
    local_60._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
    local_60.type_ = TYPE_BYTES;
    local_60.use_strict_base64_decoding_ = true;
    name_00.length_ = local_38;
    local_60.field_2.i64_ = (int64)_Var2._M_p;
    local_60.field_2.str_.size_ = size;
    RenderDataPiece(this,name_00,&local_60);
  }
  return this;
}

Assistant:

DefaultValueObjectWriter* DefaultValueObjectWriter::RenderBytes(
    StringPiece name, StringPiece value) {
  if (current_ == nullptr) {
    ow_->RenderBytes(name, value);
  } else {
    // Since StringPiece is essentially a pointer, takes a copy of "value" to
    // avoid ownership issues.
    string_values_.emplace_back(new std::string(value));
    RenderDataPiece(name, DataPiece(*string_values_.back(), false, true));
  }
  return this;
}